

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void av1_lowbd_inv_txfm2d_add_idtx_ssse3(int32_t *input,uint8_t *output,int stride,TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  int row;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  uint8_t *output_00;
  int32_t *input_00;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int stride_00;
  bool bVar10;
  int in_stack_fffffffffffffef8;
  __m128i buf [8];
  
  pcVar3 = av1_inv_txfm_shift_ls[CONCAT71(in_register_00000009,tx_size) & 0xffffffff];
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_size) << 2);
  iVar1 = *(int *)((long)tx_size_wide_log2 + uVar5);
  iVar2 = *(int *)((long)tx_size_high_log2 + uVar5);
  iVar4 = *(int *)((long)tx_size_wide + uVar5);
  iVar7 = 0x20;
  if (iVar4 < 0x20) {
    iVar7 = iVar4;
  }
  row = *(int *)((long)tx_size_high + uVar5);
  stride_00 = 0x20;
  if (row < 0x20) {
    stride_00 = row;
  }
  iVar4 = get_rect_tx_log_ratio(iVar4,row);
  uVar6 = 0;
  uVar5 = (ulong)(uint)(stride_00 >> 3);
  if (stride_00 >> 3 < 1) {
    uVar5 = uVar6;
  }
  uVar8 = (ulong)(uint)(iVar7 >> 3);
  if (iVar7 >> 3 < 1) {
    uVar8 = uVar6;
  }
  while( true ) {
    output_00 = output;
    input_00 = input;
    uVar9 = uVar5;
    if (uVar6 == uVar8) break;
    while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
      iVar7 = iVar4;
      iidentity_row_8xn_ssse3
                (buf,input_00,stride_00,(int)*pcVar3,iVar1 + -2,iVar4,in_stack_fffffffffffffef8);
      transpose_16bit_8x8(buf,buf);
      iidentity_col_8xn_ssse3(output_00,stride,buf,(int)pcVar3[1],iVar2 + -2,iVar7);
      input_00 = input_00 + 8;
      output_00 = output_00 + (long)stride * 8;
    }
    uVar6 = uVar6 + 1;
    input = input + (long)stride_00 * 8;
    output = output + 8;
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_idtx_ssse3(const int32_t *input, uint8_t *output,
                                         int stride, TX_SIZE tx_size) {
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int col_max = AOMMIN(32, txfm_size_col);
  const int row_max = AOMMIN(32, txfm_size_row);
  const int input_stride = row_max;
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  for (int i = 0; i < (col_max >> 3); ++i) {
    for (int j = 0; j < (row_max >> 3); j++) {
      __m128i buf[8];
      iidentity_row_8xn_ssse3(buf, input + j * 8 + i * 8 * input_stride,
                              row_max, shift[0], 8, txw_idx, rect_type);
      transpose_16bit_8x8(buf, buf);
      iidentity_col_8xn_ssse3(output + i * 8 + j * 8 * stride, stride, buf,
                              shift[1], 8, txh_idx);
    }
  }
}